

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  ushort *puVar1;
  char *pcVar2;
  Pgno parent;
  BtShared *pBt;
  char cVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  u8 *puVar9;
  undefined8 uVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  Btree *pBVar15;
  Btree *pBVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  u64 v;
  u8 *__dest;
  uchar *pCell;
  MemPage *pPage;
  bool bVar20;
  int loc;
  int rc;
  UnpackedRecord r;
  uint local_cc;
  MemPage *local_c8;
  int local_c0;
  Pgno local_bc;
  ulong local_b8;
  int local_ac;
  KeyInfo *local_a8;
  BtreePayload *local_a0;
  Btree *local_98;
  uint local_8c;
  BtCursor *local_88;
  u8 *local_80;
  uint local_74;
  uint *local_70;
  BtreePayload local_68;
  BtShared *local_38;
  
  pBVar15 = pCur->pBtree;
  uVar6 = local_cc;
  local_ac = seekResult;
  if ((pCur->curFlags & 0x20) != 0) {
    local_cc = saveAllCursors(pBVar15->pBt,pCur->pgnoRoot,pCur);
    if (local_cc != 0) {
      return local_cc;
    }
    uVar6 = 0;
    if ((seekResult != 0) && (pCur->iPage < '\0')) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13803,
                  "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
      return 0xb;
    }
  }
  local_cc = uVar6;
  if ((2 < pCur->eState) && (local_cc = moveToRoot(pCur), (local_cc & 0xffffffef) != 0)) {
    return local_cc;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    if (pBVar15->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBVar15,pCur->pgnoRoot,pX->nKey,0);
    }
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar5 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&local_ac);
        if (iVar5 != 0) {
          return iVar5;
        }
        local_cc = 0;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar5 = btreeOverwriteCell(pCur,pX);
      return iVar5;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar5 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&local_ac);
      }
      else {
        local_68.nKey = (sqlite3_int64)pX->aMem;
        local_68.aMem._6_1_ = 0;
        local_68._34_1_ = 0;
        local_68.pKey = pCur->pKeyInfo;
        local_68.aMem._4_2_ = pX->nMem;
        iVar5 = sqlite3BtreeIndexMoveto(pCur,(UnpackedRecord *)&local_68,&local_ac);
      }
      if (iVar5 != 0) {
        return iVar5;
      }
      local_cc = 0;
    }
    if (local_ac == 0) {
      getCellInfo(pCur);
      if ((pCur->info).nKey == pX->nKey) {
        local_68.pData = pX->pKey;
        local_68.nData = (int)pX->nKey;
        local_68.nZero = 0;
        iVar5 = btreeOverwriteCell(pCur,&local_68);
        return iVar5;
      }
    }
  }
  pPage = pCur->pPage;
  if (pPage->nFree < 0) {
    if (pCur->eState < 2) {
      iVar5 = btreeComputeFreeSpace(pPage);
    }
    else {
      iVar5 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1387e,
                  "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    local_cc = 0;
  }
  puVar9 = pBVar15->pBt->pTmpSpace;
  local_98 = pBVar15;
  local_80 = puVar9;
  if ((char)flags < '\0') {
    local_cc = 0;
    uVar6 = pBVar15->pBt->nPreformatSize;
    uVar8 = (ulong)uVar6;
    if ((int)uVar6 < 4) {
      puVar9[3] = '\0';
      uVar8 = 4;
    }
    if ((pBVar15->pBt->autoVacuum != '\0') && ((uint)pPage->maxLocal < (uint)uVar8)) {
      (*pPage->xParseCell)(pPage,puVar9,(CellInfo *)&local_68);
      if ((uint)local_68.pData != local_68.pData._4_2_) {
        uVar6 = *(uint *)(local_80 + (uVar8 - 4));
        ptrmapPut(local_98->pBt,
                  uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18,
                  '\x03',pPage->pgno,(int *)&local_cc);
        uVar6 = local_cc;
        goto joined_r0x00146a1a;
      }
    }
  }
  else {
    bVar11 = pPage->childPtrSize;
    local_c8 = pPage;
    local_c0 = flags;
    local_a0 = pX;
    if (pPage->intKey == '\0') {
      pvVar14 = pX->pKey;
      uVar13 = pX->nKey;
      if ((uint)uVar13 < 0x80) {
        puVar9[bVar11] = (u8)uVar13;
        uVar6 = 1;
      }
      else {
        uVar6 = sqlite3PutVarint(puVar9 + bVar11,(long)(int)(uint)uVar13);
        uVar6 = uVar6 & 0xff;
      }
      iVar5 = uVar6 + bVar11;
      v = uVar13 & 0xffffffff;
    }
    else {
      uVar13 = (ulong)pX->nData;
      v = (long)pX->nZero + uVar13;
      pvVar14 = pX->pData;
      if ((uint)v < 0x80) {
        puVar9[bVar11] = (u8)v;
        uVar6 = 1;
      }
      else {
        uVar6 = sqlite3PutVarint(puVar9 + bVar11,v);
        uVar6 = uVar6 & 0xff;
      }
      iVar5 = sqlite3PutVarint(puVar9 + (uVar6 + bVar11),local_a0->nKey);
      iVar5 = iVar5 + uVar6 + bVar11;
    }
    __dest = puVar9 + iVar5;
    iVar18 = (int)v;
    if ((int)(uint)local_c8->maxLocal < iVar18) {
      uVar4 = local_c8->minLocal;
      local_38 = local_c8->pBt;
      local_a8 = (KeyInfo *)0x0;
      uVar17 = (iVar18 - (uint)uVar4) % (local_38->usableSize - 4) + (uint)uVar4;
      if ((int)(uint)local_c8->maxLocal < (int)uVar17) {
        uVar17 = (uint)uVar4;
      }
      local_b8 = (ulong)(iVar5 + uVar17 + 4);
      local_70 = (uint *)(puVar9 + (int)(uVar17 + iVar5));
      local_bc = 0;
      local_88 = pCur;
      do {
        do {
          uVar19 = (uint)v;
          uVar6 = uVar17;
          if ((int)uVar19 < (int)uVar17) {
            uVar6 = uVar19;
          }
          uVar12 = (uint)uVar13;
          if ((int)uVar12 < (int)uVar6) {
            if ((int)uVar12 < 1) {
              memset(__dest,0,(long)(int)uVar6);
            }
            else {
              memcpy(__dest,pvVar14,uVar13 & 0xffffffff);
              uVar6 = uVar12;
            }
          }
          else {
            memcpy(__dest,pvVar14,(long)(int)uVar6);
          }
          pBt = local_38;
          parent = local_bc;
          v = (u64)(uVar19 - uVar6);
          if (uVar19 - uVar6 == 0 || (int)uVar19 < (int)uVar6) {
            pPage = local_c8;
            pCur = local_88;
            pX = local_a0;
            flags = local_c0;
            uVar8 = local_b8;
            uVar6 = 0;
            if (local_a8 != (KeyInfo *)0x0) {
              sqlite3PagerUnrefNotNull((DbPage *)local_a8[2].aColl[0]);
              pPage = local_c8;
              pCur = local_88;
              pX = local_a0;
              flags = local_c0;
              uVar8 = local_b8;
            }
            goto joined_r0x00146a1a;
          }
          __dest = __dest + (int)uVar6;
          pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar6);
          uVar13 = (ulong)(uVar12 - uVar6);
          uVar17 = uVar17 - uVar6;
        } while (uVar17 != 0);
        local_68.pKey = (KeyInfo *)0x0;
        if (local_38->autoVacuum != '\0') {
          do {
            uVar17 = local_bc;
            local_bc = uVar17 + 1;
            uVar6 = 0;
            if (1 < local_bc) {
              iVar5 = (uVar17 - 1) - (uVar17 - 1) % (local_38->usableSize / 5 + 1);
              uVar6 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / local_38->pageSize) +
                      2;
            }
          } while ((local_bc == uVar6) || (uVar17 == (uint)sqlite3PendingByte / local_38->pageSize))
          ;
          local_bc = uVar17 + 1;
        }
        local_8c = allocateBtreePage(local_38,(MemPage **)&local_68,&local_bc,local_bc,'\0');
        if (((local_8c == 0 && pBt->autoVacuum != '\0') &&
            (ptrmapPut(pBt,local_bc,'\x04' - (parent == 0),parent,(int *)&local_8c), local_8c != 0))
           && ((KeyInfo *)local_68.pKey != (KeyInfo *)0x0)) {
          sqlite3PagerUnrefNotNull((DbPage *)((KeyInfo *)((long)local_68.pKey + 0x50))->aColl[0]);
        }
        uVar19 = local_8c;
        if (local_8c == 0) {
          *local_70 = local_bc >> 0x18 | (local_bc & 0xff0000) >> 8 | (local_bc & 0xff00) << 8 |
                      local_bc << 0x18;
          if (local_a8 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_a8[2].aColl[0]);
          }
          local_70 = *(uint **)((long)local_68.pKey + 0x50);
          *local_70 = 0;
          local_a8 = (KeyInfo *)local_68.pKey;
          __dest = (u8 *)(*(long *)((long)local_68.pKey + 0x50) + 4);
          uVar17 = pBt->usableSize - 4;
        }
        else {
          uVar17 = 0;
          if (local_a8 == (KeyInfo *)0x0) {
            local_74 = local_8c;
          }
          else {
            sqlite3PagerUnrefNotNull((DbPage *)local_a8[2].aColl[0]);
            local_74 = uVar19;
          }
        }
        pPage = local_c8;
        pCur = local_88;
        pX = local_a0;
        flags = local_c0;
        uVar8 = local_b8;
        uVar6 = local_74;
      } while (uVar19 == 0);
    }
    else {
      uVar8 = (ulong)(uint)(iVar5 + iVar18);
      if (iVar5 + iVar18 < 4) {
        __dest[iVar18] = '\0';
        uVar8 = 4;
      }
      iVar5 = (int)uVar13;
      memcpy(__dest,pvVar14,(long)iVar5);
      memset(__dest + iVar5,0,(long)(iVar18 - iVar5));
      pPage = local_c8;
      pX = local_a0;
      flags = local_c0;
      uVar6 = 0;
    }
joined_r0x00146a1a:
    local_cc = uVar6;
    if (local_cc != 0) {
      return local_cc;
    }
  }
  uVar4 = pCur->ix;
  uVar13 = (ulong)uVar4;
  uVar6 = (uint)uVar4;
  (pCur->info).nSize = 0;
  local_b8 = uVar8;
  local_a8 = (KeyInfo *)uVar13;
  if (local_ac == 0) {
    if (uVar4 < pPage->nCell) {
      local_cc = sqlite3PagerWrite(pPage->pDbPage);
      if (local_cc == 0) {
        pCell = pPage->aData +
                (CONCAT11(pPage->aCellIdx[uVar13 * 2],pPage->aCellIdx[uVar13 * 2 + 1]) &
                pPage->maskPage);
        if (pPage->leaf == '\0') {
          *(undefined4 *)local_80 = *(undefined4 *)pCell;
        }
        local_c8 = pPage;
        (*pPage->xParseCell)(pPage,pCell,(CellInfo *)&local_68);
        uVar17 = 0;
        if ((uint)local_68.pData != local_68.pData._4_2_) {
          uVar17 = clearCellOverflow(local_c8,pCell,(CellInfo *)&local_68);
        }
        pPage = local_c8;
        pCur->curFlags = pCur->curFlags & 0xfb;
        local_cc = uVar17;
        if ((uint)local_b8 == local_68.pData._6_2_) {
          if (((uint)local_68.pData == local_68.pData._4_2_) &&
             ((local_98->pBt->autoVacuum == '\0' ||
              ((int)(uint)local_b8 < (int)(uint)local_c8->minLocal)))) {
            if (pCell < local_c8->aData + (ulong)local_c8->hdrOffset + 10) {
              uVar6 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x138c3,
                          "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
              cVar3 = '\x01';
            }
            else {
              if (local_c8->aDataEnd < pCell + (int)(uint)local_b8) {
                uVar6 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x138c6,
                            "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
              }
              else {
                memcpy(pCell,local_80,(long)(int)(uint)local_b8);
                uVar6 = 0;
              }
              cVar3 = '\x01';
              pPage = local_c8;
            }
            goto LAB_0014703c;
          }
        }
        dropCell(local_c8,(uint)uVar4,(uint)local_68.pData._6_2_,(int *)&local_cc);
        cVar3 = (local_cc != 0) * '\x02';
      }
      else {
        cVar3 = '\x02';
      }
    }
    else {
      uVar6 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x138a8,
                  "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
      cVar3 = '\x01';
    }
LAB_0014703c:
    if (cVar3 != '\0') {
      if (cVar3 == '\x02') {
        return local_cc;
      }
      return uVar6;
    }
  }
  else if ((local_ac < 0) && (pPage->nCell != 0)) {
    pCur->ix = uVar4 + 1;
    pCur->curFlags = pCur->curFlags & 0xf9;
    local_a8 = (KeyInfo *)(ulong)(ushort)(uVar4 + 1);
  }
  uVar6 = (int)local_b8 + 2;
  if (pPage->nFree < (int)uVar6) {
    bVar11 = pPage->nOverflow;
    pPage->nOverflow = bVar11 + 1;
    pPage->apOvfl[bVar11] = local_80;
    pPage->aiOvfl[bVar11] = (u16)local_a8;
  }
  else {
    uVar17 = sqlite3PagerWrite(pPage->pDbPage);
    if (uVar17 == 0) {
      local_98 = (Btree *)pPage->aData;
      uVar8 = (ulong)pPage->hdrOffset;
      local_68.pKey = (void *)((ulong)local_68.pKey & 0xffffffff00000000);
      uVar17 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
      uVar4 = *(ushort *)((long)&local_98->db + uVar8 + 5);
      uVar4 = uVar4 << 8 | uVar4 >> 8;
      uVar19 = (uint)uVar4;
      local_c8 = pPage;
      local_c0 = flags;
      local_a0 = pX;
      local_88 = pCur;
      if (uVar4 < uVar17) {
        if ((uVar19 == 0) && (uVar19 = 0x10000, pPage->pBt->usableSize == 0x10000))
        goto LAB_00147160;
        uVar10 = 0x11ac3;
LAB_00147154:
        iVar5 = 0;
        pBVar15 = (Btree *)0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
      }
      else {
        if ((int)pPage->pBt->usableSize < (int)uVar19) {
          uVar10 = 0x11ac6;
          goto LAB_00147154;
        }
LAB_00147160:
        if (((*(char *)((long)&local_98->db + uVar8 + 2) != '\0') ||
            (iVar5 = 0, *(char *)((long)&local_98->db + uVar8 + 1) != '\0')) &&
           (iVar5 = 0, uVar17 + 2 <= uVar19)) {
          puVar9 = pageFindSlot(pPage,(int)local_b8,(int *)&local_68);
          if (puVar9 == (u8 *)0x0) {
            pBVar15 = (Btree *)((ulong)local_68.pKey & 0xffffffff);
            bVar20 = (int)local_68.pKey == 0;
            iVar5 = 0;
          }
          else {
            iVar5 = (int)puVar9 - (int)local_98;
            bVar20 = false;
            if ((int)uVar17 < iVar5) {
              pBVar15 = (Btree *)0x0;
            }
            else {
              pBVar15 = (Btree *)0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11ad7,
                          "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
              bVar20 = false;
            }
          }
          if (!bVar20) goto LAB_00147256;
        }
        if ((int)uVar19 < (int)(uVar17 + uVar6)) {
          iVar7 = local_c8->nFree - uVar6;
          iVar18 = 4;
          if (iVar7 < 4) {
            iVar18 = iVar7;
          }
          uVar17 = defragmentPage(local_c8,iVar18);
          pBVar15 = (Btree *)(ulong)uVar17;
          local_68.pKey = (void *)CONCAT44(local_68.pKey._4_4_,uVar17);
          if (uVar17 != 0) goto LAB_00147256;
          uVar19 = (((uint)*(byte *)((long)&local_98->db + uVar8 + 5) * 0x100 +
                    (uint)*(byte *)((long)&local_98->db + uVar8 + 6)) - 1 & 0xffff) + 1;
        }
        iVar5 = uVar19 - (uint)local_b8;
        *(ushort *)((long)&local_98->db + uVar8 + 5) = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
        pBVar15 = (Btree *)0x0;
      }
LAB_00147256:
      pBVar16 = local_98;
      pPage = local_c8;
      if ((int)pBVar15 == 0) {
        local_c8->nFree = local_c8->nFree - (uVar6 & 0xffff);
        memcpy((void *)((long)&local_98->db + (long)iVar5),local_80,(long)(int)(uint)local_b8);
        uVar8 = (ulong)local_a8 & 0xffffffff;
        puVar1 = (ushort *)(pPage->aCellIdx + uVar8 * 2);
        memmove(puVar1 + 1,pPage->aCellIdx + uVar8 * 2,(pPage->nCell - uVar8) * 2);
        pCur = local_88;
        pX = local_a0;
        flags = local_c0;
        *puVar1 = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
        pPage->nCell = pPage->nCell + 1;
        pcVar2 = (char *)((long)&pBVar16->db + (ulong)pPage->hdrOffset + 4);
        *pcVar2 = *pcVar2 + '\x01';
        if (*pcVar2 == '\0') {
          pcVar2 = (char *)((long)&pBVar16->db + (ulong)pPage->hdrOffset + 3);
          *pcVar2 = *pcVar2 + '\x01';
        }
        if (pPage->pBt->autoVacuum == '\0') {
          bVar20 = true;
        }
        else {
          local_68.pKey = (void *)((ulong)local_68.pKey & 0xffffffff00000000);
          ptrmapPutOvflPtr(pPage,pPage,local_80,(int *)&local_68);
          pBVar16 = (Btree *)((ulong)local_68.pKey & 0xffffffff);
          bVar20 = (int)local_68.pKey == 0;
        }
      }
      else {
        bVar20 = false;
        pBVar16 = pBVar15;
        pCur = local_88;
        pX = local_a0;
        flags = local_c0;
      }
    }
    else {
      bVar20 = false;
      pBVar16 = (Btree *)(ulong)uVar17;
    }
    bVar11 = (byte)flags;
    local_cc = (uint)pBVar16;
    if (!bVar20) goto LAB_00147337;
  }
  bVar11 = (byte)flags;
  local_cc = 0;
LAB_00147337:
  if (pPage->nOverflow != '\0') {
    pCur->curFlags = pCur->curFlags & 0xf9;
    local_cc = balance(pCur);
    pCur->pPage->nOverflow = '\0';
    pCur->eState = '\x01';
    if ((local_cc == 0 & bVar11 >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur);
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        pvVar14 = sqlite3Malloc(pX->nKey);
        pCur->pKey = pvVar14;
        if (pvVar14 == (void *)0x0) {
          local_cc = 7;
        }
        else {
          memcpy(pvVar14,pX->pKey,pX->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pX->nKey;
    }
  }
  return local_cc;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}